

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O3

type * Disa::operator-(type *__return_storage_ptr__,Matrix_Dense<double,_2UL,_2UL> *matrix_0,
                      Matrix_Dense<double,_0UL,_0UL> *matrix_1)

{
  pointer pVVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  unsigned_long __val;
  size_type *local_1d0;
  size_type local_1c8;
  size_type local_1c0;
  undefined8 uStack_1b8;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  
  pVVar1 = (matrix_1->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ).
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  location = (matrix_1->
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ).
             super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (((pVVar1 != location) &&
      (location = (pointer)((long)location - (long)pVVar1), location == (pointer)0x30)) &&
     (location = (pointer)((long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start), location == (pointer)0x10)) {
    local_198 = std::
                _Function_handler<double_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:513:3)>
                ::_M_invoke;
    local_1a0 = std::
                _Function_handler<double_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/matrix_dense.hpp:513:3)>
                ::_M_manager;
    local_1b0._M_unused._M_object = matrix_0;
    local_1b0._8_8_ = matrix_1;
    Matrix_Dense<double,_2UL,_2UL>::Matrix_Dense
              (__return_storage_ptr__,(function<double_(unsigned_long,_unsigned_long)> *)&local_1b0,
               2,2);
    if (local_1a0 != (code *)0x0) {
      (*local_1a0)(&local_1b0,&local_1b0,3);
    }
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_30 = &PTR_s__workspace_llm4binary_github_lic_00184618;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
             (Disa *)0x0,(Log_Level)&local_30,(source_location *)location);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_1b0._M_unused._0_8_,local_1b0._8_8_);
  std::__cxx11::to_string(&local_d0,2);
  std::operator+(&local_b0,"Incompatible matrix dimensions, ",&local_d0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_b0,",");
  local_190._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == paVar4) {
    local_190.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  }
  else {
    local_190.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_190._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_f0,2);
  std::operator+(&local_90,&local_190,&local_f0);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_90," vs. ");
  local_170._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == paVar4) {
    local_170.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_170.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_170._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string
            (&local_110,
             ((long)(matrix_1->
                    super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ).
                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(matrix_1->
                    super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ).
                    super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::operator+(&local_70,&local_170,&local_110);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,",");
  local_150._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p == paVar4) {
    local_150.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_150._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pVVar1 = (matrix_1->
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ).
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == (matrix_1->
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ).
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    __val = 0;
  }
  else {
    __val = (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pVVar1->super_vector<double,_std::allocator<double>_>).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  }
  std::__cxx11::to_string(&local_130,__val);
  std::operator+(&local_50,&local_150,&local_130);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,".");
  local_1d0 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0 == paVar4) {
    local_1c0 = paVar4->_M_allocated_capacity;
    uStack_1b8 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = paVar4->_M_allocated_capacity;
  }
  local_1c8 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1d0,local_1c8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)local_1b0._M_pod_data);
  exit(1);
}

Assistant:

typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type constexpr
operator-(const Matrix_Dense<_type, _row_0, _col_0>& matrix_0, const Matrix_Dense<_type, _row_1, _col_1>& matrix_1) {
  ASSERT_DEBUG(matrix_0.size() == matrix_1.size(),
               "Incompatible matrix dimensions, " + std::to_string(matrix_0.size_row()) + "," +
               std::to_string(matrix_0.size_column()) + " vs. " + std::to_string(matrix_1.size_row()) + "," +
               std::to_string(matrix_1.size_column()) + ".");
  typedef typename Static_Promoter<Matrix_Dense<_type, _row_0, _col_0>, Matrix_Dense<_type, _row_1, _col_1>>::type
  _return_matrix;
  return _return_matrix(
  [&](std::size_t i_row, std::size_t i_column) { return matrix_0[i_row][i_column] - matrix_1[i_row][i_column]; },
  matrix_0.size_row(), matrix_0.size_column());
}